

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

size_t __thiscall
c4::yml::Tree::move(Tree *this,Tree *src,size_t node,size_t new_parent,size_t after)

{
  code *pcVar1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  bool bVar6;
  size_t sVar7;
  char msg [31];
  char local_f8 [48];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  char *pcStack_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  char *pcStack_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  char *pcStack_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  char *pcStack_38;
  undefined8 local_30;
  
  if (src == (Tree *)0x0) {
    builtin_strncpy(local_f8,"check failed: (src != nullptr)",0x1f);
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar1 = (code *)swi(3);
        sVar7 = (*pcVar1)();
        return sVar7;
      }
    }
    local_50 = 0;
    uStack_48 = 0x654a;
    local_40 = 0;
    pcStack_38 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_30 = 0x65;
    LVar2.super_LineCol.col = 0;
    LVar2.super_LineCol.offset = SUB168(ZEXT816(0x654a) << 0x40,0);
    LVar2.super_LineCol.line = SUB168(ZEXT816(0x654a) << 0x40,8);
    LVar2.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar2.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_f8,0x1f,LVar2,(this->m_callbacks).m_user_data);
  }
  if (node == 0xffffffffffffffff) {
    builtin_strncpy(local_f8,"check failed: (node != NONE)",0x1d);
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar1 = (code *)swi(3);
        sVar7 = (*pcVar1)();
        return sVar7;
      }
    }
    local_78 = 0;
    uStack_70 = 0x654b;
    local_68 = 0;
    pcStack_60 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_58 = 0x65;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x654b) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x654b) << 0x40,8);
    LVar3.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar3.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_f8,0x1d,LVar3,(this->m_callbacks).m_user_data);
  }
  if (new_parent == 0xffffffffffffffff) {
    builtin_strncpy(local_f8,"check failed: (new_parent != NONE)",0x23);
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar1 = (code *)swi(3);
        sVar7 = (*pcVar1)();
        return sVar7;
      }
    }
    local_a0 = 0;
    uStack_98 = 0x654c;
    local_90 = 0;
    pcStack_88 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_80 = 0x65;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x654c) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x654c) << 0x40,8);
    LVar4.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar4.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_f8,0x23,LVar4,(this->m_callbacks).m_user_data);
  }
  if (new_parent == after) {
    builtin_strncpy(local_f8,"check failed: (new_parent != after)",0x24);
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar1 = (code *)swi(3);
        sVar7 = (*pcVar1)();
        return sVar7;
      }
    }
    local_c8 = 0;
    uStack_c0 = 0x654d;
    local_b8 = 0;
    pcStack_b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_a8 = 0x65;
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x654d) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x654d) << 0x40,8);
    LVar5.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar5.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_f8,0x24,LVar5,(this->m_callbacks).m_user_data);
  }
  sVar7 = duplicate(this,src,node,new_parent,after);
  remove_children(src,node);
  _release(src,node);
  return sVar7;
}

Assistant:

size_t Tree::move(Tree *src, size_t node, size_t new_parent, size_t after)
{
    _RYML_CB_ASSERT(m_callbacks, src != nullptr);
    _RYML_CB_ASSERT(m_callbacks, node != NONE);
    _RYML_CB_ASSERT(m_callbacks, new_parent != NONE);
    _RYML_CB_ASSERT(m_callbacks, new_parent != after);

    size_t dup = duplicate(src, node, new_parent, after);
    src->remove(node);
    return dup;
}